

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O1

void aom_noise_tx_add_energy(aom_noise_tx_t *noise_tx,float *psd)

{
  uint uVar1;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  int xb;
  long lVar5;
  
  uVar1 = noise_tx->block_size;
  uVar2 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    pfVar3 = noise_tx->tx_block + 1;
    uVar4 = 0;
    do {
      lVar5 = 0;
      do {
        psd[lVar5] = pfVar3[lVar5 * 2 + -1] * pfVar3[lVar5 * 2 + -1] +
                     pfVar3[lVar5 * 2] * pfVar3[lVar5 * 2] + psd[lVar5];
        lVar5 = lVar5 + 1;
      } while ((ulong)(uVar1 >> 1) + 1 != lVar5);
      uVar4 = uVar4 + 1;
      pfVar3 = pfVar3 + uVar2 * 2;
      psd = psd + uVar2;
    } while (uVar4 != uVar2);
  }
  return;
}

Assistant:

void aom_noise_tx_add_energy(const struct aom_noise_tx_t *noise_tx,
                             float *psd) {
  const int block_size = noise_tx->block_size;
  for (int yb = 0; yb < block_size; ++yb) {
    for (int xb = 0; xb <= block_size / 2; ++xb) {
      float *c = noise_tx->tx_block + 2 * (yb * block_size + xb);
      psd[yb * block_size + xb] += c[0] * c[0] + c[1] * c[1];
    }
  }
}